

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

SimplePragmaExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SimplePragmaExpressionSyntax,slang::syntax::SimplePragmaExpressionSyntax_const&>
          (BumpAllocator *this,SimplePragmaExpressionSyntax *args)

{
  SyntaxNode *pSVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  SyntaxKind SVar6;
  undefined4 uVar7;
  SimplePragmaExpressionSyntax *pSVar8;
  
  pSVar8 = (SimplePragmaExpressionSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((SimplePragmaExpressionSyntax *)this->endPtr < pSVar8 + 1) {
    pSVar8 = (SimplePragmaExpressionSyntax *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pSVar8 + 1);
  }
  (pSVar8->value).info = (args->value).info;
  SVar6 = (args->super_PragmaExpressionSyntax).super_SyntaxNode.kind;
  uVar7 = *(undefined4 *)&(args->super_PragmaExpressionSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_PragmaExpressionSyntax).super_SyntaxNode.parent;
  TVar2 = (args->value).kind;
  uVar3 = (args->value).field_0x2;
  NVar4.raw = (args->value).numFlags.raw;
  uVar5 = (args->value).rawLen;
  (pSVar8->super_PragmaExpressionSyntax).super_SyntaxNode.previewNode =
       (args->super_PragmaExpressionSyntax).super_SyntaxNode.previewNode;
  (pSVar8->value).kind = TVar2;
  (pSVar8->value).field_0x2 = uVar3;
  (pSVar8->value).numFlags = (NumericTokenFlags)NVar4.raw;
  (pSVar8->value).rawLen = uVar5;
  (pSVar8->super_PragmaExpressionSyntax).super_SyntaxNode.kind = SVar6;
  *(undefined4 *)&(pSVar8->super_PragmaExpressionSyntax).super_SyntaxNode.field_0x4 = uVar7;
  (pSVar8->super_PragmaExpressionSyntax).super_SyntaxNode.parent = pSVar1;
  return pSVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }